

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O2

Coroutine * __thiscall
squall::TableBase::co_call<>(Coroutine *__return_storage_ptr__,TableBase *this,string *name)

{
  SQInteger SVar1;
  
  SVar1 = sq_gettop(this->vm_);
  detail::call_setup<>(this->vm_,&this->tableobj_,name);
  __return_storage_ptr__->vm_ = this->vm_;
  __return_storage_ptr__->top_ = SVar1;
  Coroutine::check_suspended(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Coroutine co_call(const string& name, T... args) {
        SQInteger top = sq_gettop(handle());
        detail::call_setup(vm_, tableobj_, name, args...);
        return Coroutine(vm_, top);
    }